

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

bool rgbcx::unpack_bc1(void *pBlock_bits,void *pPixels,bool set_alpha,bc1_approx_mode mode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ushort uVar5;
  ushort uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  uint32_t y;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  undefined7 in_register_00000011;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined4 local_58;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined4 local_4c;
  ulong local_48;
  ulong local_40;
  undefined4 local_38;
  uint local_34;
  
  local_38 = (int)CONCAT71(in_register_00000011,set_alpha);
  uVar5 = *pBlock_bits;
  uVar6 = *(ushort *)((long)pBlock_bits + 2);
  uVar17 = (uint)(uVar5 >> 0xb);
  uVar9 = uVar5 >> 5 & 0x3f;
  uVar15 = uVar5 & 0x1f;
  uVar16 = (uint)(uVar5 >> 0xd) + uVar17 * 8;
  iVar1 = (uVar9 >> 4) + uVar9 * 4;
  uVar9 = (uVar15 >> 2) + uVar15 * 8;
  uVar13 = (uint)(uVar6 >> 0xb);
  uVar10 = uVar6 >> 5 & 0x3f;
  uVar14 = uVar6 & 0x1f;
  iVar2 = (uVar10 >> 4) + uVar10 * 4;
  iVar3 = (uint)(uVar6 >> 0xd) + uVar13 * 8;
  iVar4 = (uVar14 >> 2) + uVar14 * 8;
  local_48 = (ulong)uVar16;
  local_58._0_1_ = (char)uVar16;
  local_58._1_1_ = (char)iVar1;
  local_40 = (ulong)uVar9;
  local_58._2_1_ = (char)uVar9;
  local_58._3_1_ = 0xff;
  local_54 = (char)iVar3;
  local_53 = (char)iVar2;
  local_52 = (char)iVar4;
  local_51 = 0xff;
  local_34 = (uint)uVar5;
  if (uVar5 <= uVar6) {
    switch(mode) {
    case cBC1Ideal:
    case cBC1IdealRound4:
      local_4e = (undefined1)(iVar4 + uVar9 >> 1);
      local_50 = (char)(iVar3 + uVar16 >> 1);
      local_4f = (char)((uint)(iVar2 + iVar1) >> 1);
      break;
    case cBC1NVidia:
      uVar16 = iVar2 - iVar1;
      local_4e = (undefined1)((uVar14 + uVar15) * 0x21 >> 3);
      local_50 = (char)((uVar13 + uVar17) * 0x21 >> 3);
      local_4f = (char)((long)(int)((int)(short)((int)((uint)(ushort)((short)uVar16 >> 0xf) << 0x10
                                                      | uVar16 & 0xffff) / 4) +
                                    uVar16 * 0x80 + iVar1 * 0x100 + 0x80) / 0x100);
      break;
    case cBC1AMD:
      local_4e = (undefined1)(iVar4 + uVar9 + 1 >> 1);
      local_50 = (char)(uVar16 + iVar3 + 1 >> 1);
      local_4f = (char)(iVar1 + iVar2 + 1U >> 1);
      break;
    default:
      goto switchD_001197fa_default;
    }
    local_4d = 0xff;
switchD_001197fa_default:
    local_4c = 0;
    goto switchD_0011983a_default;
  }
  switch(mode) {
  case cBC1Ideal:
    local_50 = (char)((iVar3 + uVar16 * 2) / 3);
    local_4f = (char)((uint)(iVar2 + iVar1 * 2) / 3);
    local_4e = (char)((iVar4 + uVar9 * 2) / 3);
    local_4d = 0xff;
    uVar7 = (undefined1)((uVar16 + iVar3 * 2) / 3);
    uVar8 = (undefined1)((uint)(iVar1 + iVar2 * 2) / 3);
    uVar9 = uVar9 + iVar4 * 2;
    goto LAB_00119a48;
  case cBC1NVidia:
    uVar16 = iVar2 - iVar1;
    local_50 = (char)((uVar13 + uVar17 * 2) * 0x16 >> 3);
    local_4f = (char)((int)(uVar16 * 0x50 + iVar1 * 0x100 + 0x80 +
                           (int)(short)((int)((uint)(ushort)((short)uVar16 >> 0xf) << 0x10 |
                                             uVar16 & 0xffff) / 4)) / 0x100);
    local_4e = (char)((uVar14 + uVar15 * 2) * 0x16 >> 3);
    local_4d = 0xff;
    uVar16 = iVar1 - iVar2;
    local_4c = CONCAT13(0xff,CONCAT12((char)((uVar15 + uVar14 * 2) * 0x16 >> 3),
                                      CONCAT11((char)((long)(int)(uVar16 * 0x50 + iVar2 * 0x100 +
                                                                  0x80 + (int)(short)((int)((uint)(
                                                  ushort)((short)uVar16 >> 0xf) << 0x10 |
                                                  uVar16 & 0xffff) / 4)) / 0x100),
                                               (char)((uVar17 + uVar13 * 2) * 0x16 >> 3))));
    break;
  case cBC1AMD:
    local_50 = (char)(uVar16 * 0x2b + iVar3 * 0x15 + 0x20 >> 6);
    local_4f = (char)(iVar1 * 0x2b + iVar2 * 0x15 + 0x20U >> 6);
    local_4e = (char)(uVar9 * 0x2b + iVar4 * 0x15 + 0x20 >> 6);
    local_4d = 0xff;
    local_4c = CONCAT13(0xff,CONCAT12((char)(iVar4 * 0x2b + uVar9 * 0x15 + 0x20 >> 6),
                                      CONCAT11((char)(iVar2 * 0x2b + iVar1 * 0x15 + 0x20U >> 6),
                                               (char)(iVar3 * 0x2b + uVar16 * 0x15 + 0x20 >> 6))));
    break;
  case cBC1IdealRound4:
    local_50 = (char)((iVar3 + uVar16 * 2 + 1) / 3);
    local_4f = (char)((iVar2 + iVar1 * 2 + 1U) / 3);
    local_4e = (char)((iVar4 + 1 + uVar9 * 2) / 3);
    local_4d = 0xff;
    uVar7 = (undefined1)((uVar16 + iVar3 * 2 + 1) / 3);
    uVar8 = (undefined1)((iVar1 + iVar2 * 2 + 1U) / 3);
    uVar9 = uVar9 + iVar4 * 2 + 1;
LAB_00119a48:
    local_4c = CONCAT13(0xff,CONCAT12((char)(uVar9 / 3),CONCAT11(uVar8,uVar7)));
  }
switchD_0011983a_default:
  if (set_alpha) {
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      *(undefined4 *)pPixels = (&local_58)[*(byte *)((long)pBlock_bits + lVar11 + 4) & 3];
      *(undefined4 *)((long)pPixels + 4) =
           *(undefined4 *)
            ((long)&local_58 + (ulong)(*(byte *)((long)pBlock_bits + lVar11 + 4) & 0xc));
      *(undefined4 *)((long)pPixels + 8) =
           *(undefined4 *)
            ((long)&local_58 + (ulong)(*(byte *)((long)pBlock_bits + lVar11 + 4) >> 2 & 0xc));
      *(undefined4 *)((long)pPixels + 0xc) =
           (&local_58)[*(byte *)((long)pBlock_bits + lVar11 + 4) >> 6];
      pPixels = (void *)((long)pPixels + 0x10);
    }
  }
  else {
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      uVar12 = (ulong)(*(byte *)((long)pBlock_bits + lVar11 + 4) & 3);
      *(undefined1 *)pPixels = *(undefined1 *)(&local_58 + uVar12);
      *(undefined1 *)((long)pPixels + 1) = *(undefined1 *)((long)&local_58 + uVar12 * 4 + 1);
      *(undefined1 *)((long)pPixels + 2) = *(undefined1 *)((long)&local_58 + uVar12 * 4 + 2);
      uVar12 = (ulong)(*(byte *)((long)pBlock_bits + lVar11 + 4) & 0xc);
      *(undefined1 *)((long)pPixels + 4) = *(undefined1 *)((long)&local_58 + uVar12);
      *(undefined1 *)((long)pPixels + 5) = *(undefined1 *)((long)&local_58 + uVar12 + 1);
      *(undefined1 *)((long)pPixels + 6) = *(undefined1 *)((long)&local_58 + uVar12 + 2);
      uVar12 = (ulong)(*(byte *)((long)pBlock_bits + lVar11 + 4) >> 2 & 0xc);
      *(undefined1 *)((long)pPixels + 8) = *(undefined1 *)((long)&local_58 + uVar12);
      *(undefined1 *)((long)pPixels + 9) = *(undefined1 *)((long)&local_58 + uVar12 + 1);
      *(undefined1 *)((long)pPixels + 10) = *(undefined1 *)((long)&local_58 + uVar12 + 2);
      uVar12 = (ulong)(*(byte *)((long)pBlock_bits + lVar11 + 4) >> 6);
      *(undefined1 *)((long)pPixels + 0xc) = *(undefined1 *)(&local_58 + uVar12);
      *(undefined1 *)((long)pPixels + 0xd) = *(undefined1 *)((long)&local_58 + uVar12 * 4 + 1);
      *(undefined1 *)((long)pPixels + 0xe) = *(undefined1 *)((long)&local_58 + uVar12 * 4 + 2);
      pPixels = (void *)((long)pPixels + 0x10);
    }
  }
  return uVar5 <= uVar6;
}

Assistant:

bool unpack_bc1(const void* pBlock_bits, void* pPixels, bool set_alpha, bc1_approx_mode mode)
	{
		color32* pDst_pixels = static_cast<color32*>(pPixels);

		static_assert(sizeof(bc1_block) == 8, "sizeof(bc1_block) == 8");
		static_assert(sizeof(bc4_block) == 8, "sizeof(bc4_block) == 8");

		const bc1_block* pBlock = static_cast<const bc1_block*>(pBlock_bits);

		const uint32_t l = pBlock->get_low_color();
		const uint32_t h = pBlock->get_high_color();

		color32 c[4];

		const int cr0 = (l >> 11) & 31;
		const int cg0 = (l >> 5) & 63;
		const int cb0 = l & 31;
		const int r0 = (cr0 << 3) | (cr0 >> 2);
		const int g0 = (cg0 << 2) | (cg0 >> 4);
		const int b0 = (cb0 << 3) | (cb0 >> 2);

		const int cr1 = (h >> 11) & 31;
		const int cg1 = (h >> 5) & 63;
		const int cb1 = h & 31;
		const int r1 = (cr1 << 3) | (cr1 >> 2);
		const int g1 = (cg1 << 2) | (cg1 >> 4);
		const int b1 = (cb1 << 3) | (cb1 >> 2);

		bool used_punchthrough = false;
				
		if (l > h)
		{
			c[0].set_noclamp_rgba(r0, g0, b0, 255);
			c[1].set_noclamp_rgba(r1, g1, b1, 255);
			switch (mode)
			{
				case bc1_approx_mode::cBC1Ideal:
					c[2].set_noclamp_rgba((r0 * 2 + r1) / 3, (g0 * 2 + g1) / 3, (b0 * 2 + b1) / 3, 255);
					c[3].set_noclamp_rgba((r1 * 2 + r0) / 3, (g1 * 2 + g0) / 3, (b1 * 2 + b0) / 3, 255);
					break;
				case bc1_approx_mode::cBC1IdealRound4:
					c[2].set_noclamp_rgba((r0 * 2 + r1 + 1) / 3, (g0 * 2 + g1 + 1) / 3, (b0 * 2 + b1 + 1) / 3, 255);
					c[3].set_noclamp_rgba((r1 * 2 + r0 + 1) / 3, (g1 * 2 + g0 + 1) / 3, (b1 * 2 + b0 + 1) / 3, 255);
					break;
				case bc1_approx_mode::cBC1NVidia:
					c[2].set_noclamp_rgba(interp_5_nv(cr0, cr1), interp_6_nv(g0, g1), interp_5_nv(cb0, cb1), 255);
					c[3].set_noclamp_rgba(interp_5_nv(cr1, cr0), interp_6_nv(g1, g0), interp_5_nv(cb1, cb0), 255);
					break;
				case bc1_approx_mode::cBC1AMD:
					c[2].set_noclamp_rgba(interp_5_6_amd(r0, r1), interp_5_6_amd(g0, g1), interp_5_6_amd(b0, b1), 255);
					c[3].set_noclamp_rgba(interp_5_6_amd(r1, r0), interp_5_6_amd(g1, g0), interp_5_6_amd(b1, b0), 255);
					break;
			}
		}
		else
		{
			c[0].set_noclamp_rgba(r0, g0, b0, 255);
			c[1].set_noclamp_rgba(r1, g1, b1, 255);
			switch (mode)
			{
				case bc1_approx_mode::cBC1Ideal:
				case bc1_approx_mode::cBC1IdealRound4:
					c[2].set_noclamp_rgba((r0 + r1) / 2, (g0 + g1) / 2, (b0 + b1) / 2, 255);
					break;
				case bc1_approx_mode::cBC1NVidia:
					c[2].set_noclamp_rgba(interp_half_5_nv(cr0, cr1), interp_half_6_nv(g0, g1), interp_half_5_nv(cb0, cb1), 255);
					break;
				case bc1_approx_mode::cBC1AMD:
					c[2].set_noclamp_rgba(interp_half_5_6_amd(r0, r1), interp_half_5_6_amd(g0, g1), interp_half_5_6_amd(b0, b1), 255);
					break;
			}

			c[3].set_noclamp_rgba(0, 0, 0, 0);
			used_punchthrough = true;
		}

		if (set_alpha)
		{
			for (uint32_t y = 0; y < 4; y++, pDst_pixels += 4)
			{
				pDst_pixels[0] = c[pBlock->get_selector(0, y)];
				pDst_pixels[1] = c[pBlock->get_selector(1, y)];
				pDst_pixels[2] = c[pBlock->get_selector(2, y)];
				pDst_pixels[3] = c[pBlock->get_selector(3, y)];
			}
		}
		else
		{
			for (uint32_t y = 0; y < 4; y++, pDst_pixels += 4)
			{
				pDst_pixels[0].set_rgb(c[pBlock->get_selector(0, y)]);
				pDst_pixels[1].set_rgb(c[pBlock->get_selector(1, y)]);
				pDst_pixels[2].set_rgb(c[pBlock->get_selector(2, y)]);
				pDst_pixels[3].set_rgb(c[pBlock->get_selector(3, y)]);
			}
		}

		return used_punchthrough;
	}